

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

uint64_t roaring_bitmap_and_cardinality(roaring_bitmap_t *x1,roaring_bitmap_t *x2)

{
  ushort uVar1;
  ushort uVar2;
  int iVar3;
  int iVar4;
  uint16_t *puVar5;
  uint16_t *puVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint uVar12;
  uint64_t uVar13;
  uint uVar14;
  uint uVar15;
  
  iVar3 = (x1->high_low_container).size;
  iVar4 = (x2->high_low_container).size;
  uVar15 = 0;
  if (iVar4 < 1 || iVar3 < 1) {
    uVar13 = 0;
  }
  else {
    uVar13 = 0;
    uVar14 = 0;
    do {
      puVar5 = (x1->high_low_container).keys;
      uVar11 = uVar15 & 0xffff;
      uVar1 = puVar5[uVar11];
      puVar6 = (x2->high_low_container).keys;
      uVar12 = uVar14 & 0xffff;
      uVar2 = puVar6[uVar12];
      if (uVar1 == uVar2) {
        iVar7 = container_and_cardinality
                          ((x1->high_low_container).containers[uVar11],
                           (x1->high_low_container).typecodes[uVar11],
                           (x2->high_low_container).containers[uVar12],
                           (x2->high_low_container).typecodes[uVar12]);
        uVar13 = uVar13 + (long)iVar7;
        uVar9 = uVar15 + 1;
        uVar10 = uVar14 + 1;
      }
      else if (uVar1 < uVar2) {
        uVar12 = (x1->high_low_container).size;
        uVar11 = uVar15 + 1;
        uVar9 = uVar11;
        uVar10 = uVar14;
        if (((int)uVar11 < (int)uVar12) && (puVar5[(int)uVar11] < uVar2)) {
          uVar15 = uVar15 + 2;
          iVar7 = 1;
          if ((int)uVar15 < (int)uVar12) {
            iVar8 = 1;
            do {
              iVar7 = iVar8;
              if (uVar2 <= puVar5[(int)uVar15]) goto LAB_00123852;
              iVar7 = iVar8 * 2;
              uVar15 = uVar11 + iVar8 * 2;
              iVar8 = iVar7;
            } while ((int)uVar15 < (int)uVar12);
          }
          uVar15 = uVar12 - 1;
LAB_00123852:
          uVar9 = uVar15;
          if (((puVar5[(int)uVar15] != uVar2) && (uVar9 = uVar12, uVar2 <= puVar5[(int)uVar15])) &&
             (uVar9 = uVar15, (iVar7 >> 1) + uVar11 + 1 != uVar15)) {
            uVar11 = (iVar7 >> 1) + uVar11;
            do {
              uVar9 = (int)(uVar11 + uVar15) >> 1;
              if (puVar5[(int)uVar9] == uVar2) break;
              if (uVar2 <= puVar5[(int)uVar9]) {
                uVar15 = uVar9;
                uVar9 = uVar11;
              }
              uVar11 = uVar9;
              uVar9 = uVar15;
            } while (uVar11 + 1 != uVar15);
          }
        }
      }
      else {
        uVar12 = (x2->high_low_container).size;
        uVar11 = uVar14 + 1;
        uVar9 = uVar15;
        uVar10 = uVar11;
        if (((int)uVar11 < (int)uVar12) && (puVar6[(int)uVar11] < uVar1)) {
          uVar14 = uVar14 + 2;
          iVar7 = 1;
          if ((int)uVar14 < (int)uVar12) {
            iVar8 = 1;
            do {
              iVar7 = iVar8;
              if (uVar1 <= puVar6[(int)uVar14]) goto LAB_001238ae;
              iVar7 = iVar8 * 2;
              uVar14 = uVar11 + iVar8 * 2;
              iVar8 = iVar7;
            } while ((int)uVar14 < (int)uVar12);
          }
          uVar14 = uVar12 - 1;
LAB_001238ae:
          uVar10 = uVar14;
          if (((puVar6[(int)uVar14] != uVar1) && (uVar10 = uVar12, uVar1 <= puVar6[(int)uVar14])) &&
             (uVar10 = uVar14, (iVar7 >> 1) + uVar11 + 1 != uVar14)) {
            uVar11 = (iVar7 >> 1) + uVar11;
            do {
              uVar10 = (int)(uVar11 + uVar14) >> 1;
              if (puVar6[(int)uVar10] == uVar1) break;
              if (uVar1 <= puVar6[(int)uVar10]) {
                uVar14 = uVar10;
                uVar10 = uVar11;
              }
              uVar11 = uVar10;
              uVar10 = uVar14;
            } while (uVar11 + 1 != uVar14);
          }
        }
      }
      uVar14 = uVar10;
      uVar15 = uVar9;
    } while (((int)uVar15 < iVar3) && ((int)uVar14 < iVar4));
  }
  return uVar13;
}

Assistant:

uint64_t roaring_bitmap_and_cardinality(const roaring_bitmap_t *x1,
                                        const roaring_bitmap_t *x2) {
    const int length1 = x1->high_low_container.size,
              length2 = x2->high_low_container.size;
    uint64_t answer = 0;
    int pos1 = 0, pos2 = 0;
    while (pos1 < length1 && pos2 < length2) {
        const uint16_t s1 =
            ra_get_key_at_index(&x1->high_low_container, (uint16_t)pos1);
        const uint16_t s2 =
            ra_get_key_at_index(&x2->high_low_container, (uint16_t)pos2);

        if (s1 == s2) {
            uint8_t type1, type2;
            container_t *c1 = ra_get_container_at_index(&x1->high_low_container,
                                                        (uint16_t)pos1, &type1);
            container_t *c2 = ra_get_container_at_index(&x2->high_low_container,
                                                        (uint16_t)pos2, &type2);
            answer += container_and_cardinality(c1, type1, c2, type2);
            ++pos1;
            ++pos2;
        } else if (s1 < s2) {  // s1 < s2
            pos1 = ra_advance_until(&x1->high_low_container, s2, pos1);
        } else {  // s1 > s2
            pos2 = ra_advance_until(&x2->high_low_container, s1, pos2);
        }
    }
    return answer;
}